

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O0

size_t __thiscall AttCertValidityPeriod::SetDataSize(AttCertValidityPeriod *this)

{
  size_t sVar1;
  size_t sVar2;
  AttCertValidityPeriod *this_local;
  
  sVar1 = DerBase::EncodedSize(&(this->notBeforeTime).super_DerBase);
  sVar2 = DerBase::EncodedSize(&(this->notAfterTime).super_DerBase);
  (this->super_DerBase).cbData = sVar1 + sVar2;
  return sVar1 + sVar2;
}

Assistant:

virtual size_t SetDataSize() override { return (cbData = notBeforeTime.EncodedSize() + notAfterTime.EncodedSize()); }